

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ScalarReplacementPass::ReplaceWholeDebugDeclare
          (ScalarReplacementPass *this,Instruction *dbg_decl,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *replacements)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  IRContext *pIVar4;
  DefUseManager *pDVar5;
  Instruction *pIVar6;
  DebugInfoManager *pDVar7;
  reference ppIVar8;
  Instruction *pIVar9;
  ConstantManager *this_00;
  uint32_t local_11c;
  iterator local_118;
  undefined8 local_110;
  SmallVector<unsigned_int,_2UL> local_108;
  uint32_t local_dc;
  iterator local_d8;
  undefined8 local_d0;
  SmallVector<unsigned_int,_2UL> local_c8;
  Operand local_a0;
  Instruction *local_70;
  Instruction *added_dbg_value;
  Instruction *insert_before;
  Instruction *var;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  int32_t idx;
  Instruction *deref_expr;
  Instruction *dbg_expr;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  *replacements_local;
  Instruction *dbg_decl_local;
  ScalarReplacementPass *this_local;
  
  pIVar4 = Pass::context((Pass *)this);
  pDVar5 = IRContext::get_def_use_mgr(pIVar4);
  uVar2 = Instruction::GetSingleWordOperand(dbg_decl,6);
  pIVar6 = analysis::DefUseManager::GetDef(pDVar5,uVar2);
  pIVar4 = Pass::context((Pass *)this);
  pDVar7 = IRContext::get_debug_info_mgr(pIVar4);
  pIVar6 = analysis::DebugInfoManager::DerefDebugExpression(pDVar7,pIVar6);
  __range2._4_4_ = 0;
  __end2 = std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::begin(replacements);
  var = (Instruction *)
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        end(replacements);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                                *)&var);
    if (!bVar1) {
      return true;
    }
    ppIVar8 = __gnu_cxx::
              __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::operator*(&__end2);
    insert_before = *ppIVar8;
    added_dbg_value =
         utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                   (&insert_before->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    while (OVar3 = Instruction::opcode(added_dbg_value), OVar3 == OpVariable) {
      added_dbg_value =
           utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                     (&added_dbg_value->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
    }
    if (added_dbg_value == (Instruction *)0x0) break;
    pIVar4 = Pass::context((Pass *)this);
    pDVar7 = IRContext::get_debug_info_mgr(pIVar4);
    uVar2 = Instruction::result_id(insert_before);
    pIVar9 = analysis::DebugInfoManager::AddDebugValueForDecl
                       (pDVar7,dbg_decl,uVar2,added_dbg_value,dbg_decl);
    if (pIVar9 == (Instruction *)0x0) {
      return false;
    }
    local_70 = pIVar9;
    pIVar4 = Pass::context((Pass *)this);
    this_00 = IRContext::get_constant_mgr(pIVar4);
    local_dc = analysis::ConstantManager::GetSIntConstId(this_00,__range2._4_4_);
    local_d8 = &local_dc;
    local_d0 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list_00);
    Operand::Operand(&local_a0,SPV_OPERAND_TYPE_ID,&local_c8);
    Instruction::AddOperand(pIVar9,&local_a0);
    Operand::~Operand(&local_a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
    pIVar9 = local_70;
    local_11c = Instruction::result_id(pIVar6);
    local_118 = &local_11c;
    local_110 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_118;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_108,init_list);
    Instruction::SetOperand(pIVar9,6,&local_108);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_108);
    pIVar4 = Pass::context((Pass *)this);
    bVar1 = IRContext::AreAnalysesValid(pIVar4,kAnalysisBegin);
    if (bVar1) {
      pIVar4 = Pass::context((Pass *)this);
      pDVar5 = IRContext::get_def_use_mgr(pIVar4);
      analysis::DefUseManager::AnalyzeInstUse(pDVar5,local_70);
    }
    __range2._4_4_ = __range2._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<spvtools::opt::Instruction_*const_*,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("insert_before != nullptr && \"unexpected end of list\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0xb7,
                "bool spvtools::opt::ScalarReplacementPass::ReplaceWholeDebugDeclare(Instruction *, const std::vector<Instruction *> &)"
               );
}

Assistant:

bool ScalarReplacementPass::ReplaceWholeDebugDeclare(
    Instruction* dbg_decl, const std::vector<Instruction*>& replacements) {
  // Insert Deref operation to the front of the operation list of |dbg_decl|.
  Instruction* dbg_expr = context()->get_def_use_mgr()->GetDef(
      dbg_decl->GetSingleWordOperand(kDebugValueOperandExpressionIndex));
  auto* deref_expr =
      context()->get_debug_info_mgr()->DerefDebugExpression(dbg_expr);

  // Add DebugValue instruction with Indexes operand and Deref operation.
  int32_t idx = 0;
  for (const auto* var : replacements) {
    Instruction* insert_before = var->NextNode();
    while (insert_before->opcode() == spv::Op::OpVariable)
      insert_before = insert_before->NextNode();
    assert(insert_before != nullptr && "unexpected end of list");
    Instruction* added_dbg_value =
        context()->get_debug_info_mgr()->AddDebugValueForDecl(
            dbg_decl, /*value_id=*/var->result_id(),
            /*insert_before=*/insert_before, /*scope_and_line=*/dbg_decl);

    if (added_dbg_value == nullptr) return false;
    added_dbg_value->AddOperand(
        {SPV_OPERAND_TYPE_ID,
         {context()->get_constant_mgr()->GetSIntConstId(idx)}});
    added_dbg_value->SetOperand(kDebugValueOperandExpressionIndex,
                                {deref_expr->result_id()});
    if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse)) {
      context()->get_def_use_mgr()->AnalyzeInstUse(added_dbg_value);
    }
    ++idx;
  }
  return true;
}